

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::GetProperty_Internal<false>
               (Var instance,RecyclableObject *propertyObject,bool isRoot,PropertyId propertyId,
               Var *value,ScriptContext *requestContext,PropertyValueInfo *info)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  undefined4 *puVar6;
  DynamicType *this;
  DynamicTypeHandler *pDVar7;
  PropertyRecord *pPVar8;
  RecyclableObject *pRVar9;
  RecyclableObject *this_00;
  ScriptContext *pSVar10;
  ScriptContext *pSVar11;
  RecyclableObject *pValue;
  RecyclableObject *pObject;
  _func_int **pp_Stack_70;
  bool skipAssert;
  Var property;
  DynamicTypeHandler *dynamicTypeHandler;
  DynamicObject *dynamicObject;
  DynamicObject *pDStack_50;
  PropertyQueryFlags result;
  RootObjectBase *rootObject;
  DynamicObject *pDStack_40;
  BOOL foundProperty;
  RecyclableObject *object;
  ScriptContext *requestContext_local;
  Var *value_local;
  PropertyId propertyId_local;
  bool isRoot_local;
  RecyclableObject *propertyObject_local;
  Var instance_local;
  
  object = (RecyclableObject *)requestContext;
  requestContext_local = (ScriptContext *)value;
  value_local._0_4_ = propertyId;
  value_local._7_1_ = isRoot;
  _propertyId_local = (DynamicObject *)propertyObject;
  propertyObject_local = (RecyclableObject *)instance;
  bVar2 = TaggedNumber::Is(instance);
  if (bVar2) {
    PropertyValueInfo::ClearCacheInfo(info);
  }
  pDStack_40 = _propertyId_local;
  rootObject._4_4_ = 0;
  if ((value_local._7_1_ & 1) != 0) {
    bVar2 = VarIs<Js::RootObjectBase,Js::RecyclableObject>
                      (&_propertyId_local->super_RecyclableObject);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x755,"(VarIs<RootObjectBase>(object))",
                                  "VarIs<RootObjectBase>(object)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pDStack_50 = pDStack_40;
    rootObject._4_4_ =
         (*(pDStack_40->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
           ._vptr_IRecyclerVisitedObject[0x6c])
                   (pDStack_40,propertyObject_local,(ulong)(uint)value_local,requestContext_local,
                    info,object);
  }
  while( true ) {
    bVar2 = false;
    if (rootObject._4_4_ == 0) {
      BVar4 = IsNull(&pDStack_40->super_RecyclableObject);
      bVar2 = BVar4 == 0;
    }
    if (!bVar2) goto LAB_00fb1c6c;
    dynamicObject._4_4_ =
         (*(pDStack_40->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
           ._vptr_IRecyclerVisitedObject[0x12])
                   (pDStack_40,propertyObject_local,(ulong)(uint)value_local,requestContext_local,
                    info,object);
    if (dynamicObject._4_4_ != Property_NotFound) break;
    BVar4 = RecyclableObject::SkipsPrototype(&pDStack_40->super_RecyclableObject);
    if (BVar4 != 0) goto LAB_00fb1c6c;
    pDStack_40 = (DynamicObject *)GetPrototypeNoTrap(&pDStack_40->super_RecyclableObject);
  }
  rootObject._4_4_ = JavascriptConversion::PropertyQueryFlagsToBoolean(dynamicObject._4_4_);
LAB_00fb1c6c:
  if (rootObject._4_4_ == 0) {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ebe7c8,MissingPropertyCachePhase);
    if (bVar2) {
      ScriptContext::RecordMissingPropertyMiss((ScriptContext *)object);
    }
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,MissingPropertyCachePhase);
    if (bVar2) {
      Output::Print(L"MissingPropertyCaching: Missing property %d on slow path.\n",
                    (ulong)(uint)value_local);
    }
    TryCacheMissingProperty
              (propertyObject_local,_propertyId_local,(bool)(value_local._7_1_ & 1),
               (uint)value_local,(ScriptContext *)object,info);
    pRVar9 = ScriptContext::GetMissingPropertyResult((ScriptContext *)object);
    (requestContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo = (_func_int **)pRVar9;
    instance_local._4_4_ = 0;
  }
  else {
    bVar2 = DynamicObject::IsBaseDynamicObject(pDStack_40);
    if (bVar2) {
      dynamicTypeHandler = (DynamicTypeHandler *)pDStack_40;
      this = DynamicObject::GetDynamicType(pDStack_40);
      pDVar7 = DynamicType::GetTypeHandler(this);
      property = pDVar7;
      pPVar8 = ScriptContext::GetPropertyName((ScriptContext *)object,(uint)value_local);
      uVar5 = (*pDVar7->_vptr_DynamicTypeHandler[0x5c])
                        (pDVar7,pPVar8,&stack0xffffffffffffff90,object);
      if ((uVar5 & 1) != 0) {
        bVar2 = false;
        if ((requestContext_local != (ScriptContext *)0x0) &&
           (bVar3 = VarIs<Js::RecyclableObject>(pp_Stack_70), bVar3)) {
          pRVar9 = VarTo<Js::RecyclableObject>(pp_Stack_70);
          this_00 = VarTo<Js::RecyclableObject>
                              ((requestContext_local->super_ScriptContextInfo).
                               _vptr_ScriptContextInfo);
          pSVar10 = RecyclableObject::GetScriptContext(this_00);
          pSVar11 = RecyclableObject::GetScriptContext(pRVar9);
          bVar2 = pSVar10 != pSVar11;
        }
        if (((!bVar2) && (requestContext_local != (ScriptContext *)0x0)) &&
           ((requestContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo != pp_Stack_70))
        {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x789,
                                      "(skipAssert || value == nullptr || *value == property)",
                                      "skipAssert || value == nullptr || *value == property");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    if (((requestContext_local != (ScriptContext *)0x0) &&
        (bVar2 = ScriptContext::IsUndeclBlockVar
                           ((ScriptContext *)object,
                            (requestContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo)
        , !bVar2)) &&
       (bVar2 = VarIs<Js::UnscopablesWrapperObject,Js::RecyclableObject>
                          (&pDStack_40->super_RecyclableObject), !bVar2)) {
      CacheOperators::CachePropertyRead
                (_propertyId_local,&pDStack_40->super_RecyclableObject,(bool)(value_local._7_1_ & 1)
                 ,(uint)value_local,false,info,(ScriptContext *)object);
    }
    instance_local._4_4_ = 1;
  }
  return instance_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::GetProperty_Internal(Var instance, RecyclableObject* propertyObject, const bool isRoot, PropertyId propertyId, Var* value, ScriptContext* requestContext, PropertyValueInfo* info)
    {
        if (TaggedNumber::Is(instance))
        {
            PropertyValueInfo::ClearCacheInfo(info);
        }
        RecyclableObject* object = propertyObject;
        BOOL foundProperty = FALSE;
        if (isRoot)
        {
            Assert(VarIs<RootObjectBase>(object));

            RootObjectBase* rootObject = static_cast<RootObjectBase*>(object);
            foundProperty = rootObject->GetRootProperty(instance, propertyId, value, info, requestContext);
        }

        while (!foundProperty && !JavascriptOperators::IsNull(object))
        {
            if (unscopables && IsPropertyUnscopable(object, propertyId))
            {
                break;
            }
            else
            {
                PropertyQueryFlags result = object->GetPropertyQuery(instance, propertyId, value, info, requestContext);
                if (result != PropertyQueryFlags::Property_NotFound)
                {
                    foundProperty = JavascriptConversion::PropertyQueryFlagsToBoolean(result);
                    break;
                }
            }

            if (object->SkipsPrototype())
            {
                break;
            }

            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }

        if (foundProperty)
        {
#if ENABLE_FIXED_FIELDS && DBG
            if (DynamicObject::IsBaseDynamicObject(object))
            {
                DynamicObject* dynamicObject = (DynamicObject*)object;
                DynamicTypeHandler* dynamicTypeHandler = dynamicObject->GetDynamicType()->GetTypeHandler();
                Var property;
                if (dynamicTypeHandler->CheckFixedProperty(requestContext->GetPropertyName(propertyId), &property, requestContext))
                {
                    bool skipAssert = false;
                    if (value != nullptr && Js::VarIs<Js::RecyclableObject>(property))
                    {
                        Js::RecyclableObject* pObject = Js::VarTo<Js::RecyclableObject>(property);
                        Js::RecyclableObject* pValue = Js::VarTo<Js::RecyclableObject>(*value);

                        if (pValue->GetScriptContext() != pObject->GetScriptContext())
                        {
                            // value was marshaled. skip check
                            skipAssert = true;
                        }
                    }
                    Assert(skipAssert || value == nullptr || *value == property);
                }
            }
#endif
            // Don't cache the information if the value is undecl block var
            // REVIEW: We might want to only check this if we need to (For LdRootFld or ScopedLdFld)
            //         Also we might want to throw here instead of checking it again in the caller
            if (value && !requestContext->IsUndeclBlockVar(*value) && !VarIs<UnscopablesWrapperObject>(object))
            {
                CacheOperators::CachePropertyRead(propertyObject, object, isRoot, propertyId, false, info, requestContext);
            }
#ifdef TELEMETRY_JSO
            if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
            {
                requestContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, value, /*successful: */true);
            }
#endif

            return TRUE;
        }

        else
        {
#ifdef MISSING_PROPERTY_STATS
            if (PHASE_STATS1(MissingPropertyCachePhase))
            {
                requestContext->RecordMissingPropertyMiss();
            }
#endif
            if (PHASE_TRACE1(MissingPropertyCachePhase))
            {
                Output::Print(_u("MissingPropertyCaching: Missing property %d on slow path.\n"), propertyId);
            }

            TryCacheMissingProperty(instance, propertyObject, isRoot, propertyId, requestContext, info);

#if defined(TELEMETRY_JSO) || defined(TELEMETRY_AddToCache) // enabled for `TELEMETRY_AddToCache`, because this is the property-not-found codepath where the normal TELEMETRY_AddToCache code wouldn't be executed.
            if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
            {
                if (info && info->AllowResizingPolymorphicInlineCache()) // If in interpreted mode, not JIT.
                {
                    requestContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, nullptr);
                }
            }
#endif
            *value = requestContext->GetMissingPropertyResult();
            return FALSE;
        }
    }